

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu.cpp
# Opt level: O2

int __thiscall ncnn::GELU::forward_inplace(GELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int q;
  int iVar6;
  int i;
  ulong uVar7;
  float fVar8;
  Mat local_78;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  uVar7 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar7;
  }
  iVar3 = bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    iVar3 = 0;
  }
  if (this->fast_gelu == false) {
    while (iVar6 = (int)uVar7, iVar6 != iVar3) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,iVar6);
      pvVar2 = local_78.data;
      ncnn::Mat::~Mat(&local_78);
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        fVar1 = *(float *)((long)pvVar2 + uVar7 * 4);
        fVar8 = erfcf(fVar1 * -0.70710677);
        *(float *)((long)pvVar2 + uVar7 * 4) = fVar8 * fVar1 * 0.5;
      }
      uVar7 = (ulong)(iVar6 + 1);
    }
  }
  else {
    for (iVar6 = 0; iVar6 != iVar3; iVar6 = iVar6 + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,iVar6);
      pvVar2 = local_78.data;
      ncnn::Mat::~Mat(&local_78);
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        fVar1 = *(float *)((long)pvVar2 + uVar7 * 4);
        fVar8 = tanhf((fVar1 * fVar1 * 0.044715 * fVar1 + fVar1) * (float)0x3f4c4229);
        *(float *)((long)pvVar2 + uVar7 * 4) = (fVar8 + 1.0) * fVar1 * 0.5;
      }
    }
  }
  return 0;
}

Assistant:

int GELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (fast_gelu)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
                ptr[i] = 0.5f * ptr[i] * (1.0f + tanhf(0.79788452f * (ptr[i] + 0.044715f * ptr[i] * ptr[i] * ptr[i])));
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                // y = x * P(X <= x) where X ~ N(0, 1)
                ptr[i] = 0.5f * ptr[i] * erfcf(-0.70710678f * ptr[i]);
            }
        }
    }

    return 0;
}